

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::FileDescriptorTables::FieldsByLowercaseNamesLazyInitInternal
          (FileDescriptorTables *this)

{
  bool bVar1;
  reference pvVar2;
  char *local_60;
  void *local_58;
  undefined1 local_50 [8];
  PointerStringPair lowercase_key;
  FieldDescriptor *field;
  Symbol symbol;
  const_iterator __end2;
  const_iterator __begin2;
  SymbolsByParentSet *__range2;
  FileDescriptorTables *this_local;
  
  __end2 = std::
           unordered_set<google::protobuf::Symbol,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
           ::begin(&this->symbols_by_parent_);
  symbol.ptr_ = (SymbolBase *)
                std::
                unordered_set<google::protobuf::Symbol,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                ::end(&this->symbols_by_parent_);
  while (bVar1 = std::__detail::operator!=
                           (&__end2.super__Node_iterator_base<google::protobuf::Symbol,_true>,
                            (_Node_iterator_base<google::protobuf::Symbol,_true> *)&symbol), bVar1)
  {
    pvVar2 = std::__detail::_Node_const_iterator<google::protobuf::Symbol,_true,_true>::operator*
                       (&__end2);
    field = (FieldDescriptor *)pvVar2->ptr_;
    lowercase_key.second.length_ = (size_type)Symbol::field_descriptor((Symbol *)&field);
    if ((FieldDescriptor *)lowercase_key.second.length_ != (FieldDescriptor *)0x0) {
      local_58 = FindParentForFieldsByMap(this,(FieldDescriptor *)lowercase_key.second.length_);
      FieldDescriptor::lowercase_name_abi_cxx11_((FieldDescriptor *)lowercase_key.second.length_);
      local_60 = (char *)std::__cxx11::string::c_str();
      std::pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece>::
      pair<const_void_*,_const_char_*,_true>
                ((pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece> *)local_50
                 ,&local_58,&local_60);
      InsertIfNotPresent<std::unordered_map<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,std::equal_to<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>>,std::allocator<std::pair<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>const,google::protobuf::FieldDescriptor_const*>>>>
                (&this->fields_by_lowercase_name_,(first_type *)local_50,
                 (second_type *)&lowercase_key.second.length_);
    }
    std::__detail::_Node_const_iterator<google::protobuf::Symbol,_true,_true>::operator++(&__end2);
  }
  return;
}

Assistant:

void FileDescriptorTables::FieldsByLowercaseNamesLazyInitInternal() const {
  for (Symbol symbol : symbols_by_parent_) {
    const FieldDescriptor* field = symbol.field_descriptor();
    if (!field) continue;
    PointerStringPair lowercase_key(FindParentForFieldsByMap(field),
                                    field->lowercase_name().c_str());
    InsertIfNotPresent(&fields_by_lowercase_name_, lowercase_key, field);
  }
}